

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O2

void anon_unknown.dwarf_f949a6::WriteFilesArgument
               (ostream *os,string_view *keyword,
               vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
               *items,string *config,cmScriptGeneratorIndent indent)

{
  pointer puVar1;
  Item *pIVar2;
  ostream *poVar3;
  pointer puVar4;
  bool bVar5;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  char local_12d;
  cmScriptGeneratorIndent local_12c;
  ostream *local_128;
  string_view *local_120;
  string local_118 [32];
  char *local_f8;
  size_t local_f0;
  cmAlphaNum local_d8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  cmAlphaNum local_80;
  string local_50;
  
  local_12c.Level = indent.Level;
  local_128 = os;
  local_120 = keyword;
  std::__cxx11::string::string(local_118,(string *)config);
  puVar1 = (items->
           super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  for (puVar4 = (items->
                super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    local_d8.View_._M_len = 1;
    local_d8.View_._M_str = local_d8.Digits_;
    local_d8.Digits_[0] = '\"';
    pIVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
             .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
    (*pIVar2->_vptr_Item[2])((string *)&local_f8,pIVar2,local_118);
    local_80.View_._M_len = local_f0;
    local_80.View_._M_str = local_f8;
    local_12d = '\"';
    cmStrCat<char>(&local_50,&local_d8,&local_80,&local_12d);
    std::__cxx11::string::~string((string *)&local_f8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_a8._M_engaged == true) {
      if (bVar5) {
        poVar3 = operator<<(local_128,local_12c);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_120->_M_str,local_120->_M_len);
        std::operator<<(poVar3,"\n");
      }
      poVar3 = operator<<(local_128,local_12c);
      poVar3 = std::operator<<(poVar3,"    ");
      poVar3 = std::operator<<(poVar3,(string *)&local_a8);
      std::operator<<(poVar3,"\n");
      bVar5 = false;
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a8);
  }
  std::__cxx11::string::~string(local_118);
  return;
}

Assistant:

void WriteFilesArgument(
  std::ostream& os, const cm::string_view& keyword,
  const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
    items,
  const std::string& config, cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, items, indent,
    [config](const std::unique_ptr<cmInstallRuntimeDependencySet::Item>& i)
      -> std::string { return cmStrCat('"', i->GetItemPath(config), '"'); });
}